

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::ParseResultType>::enforceOk
          (BasicResult<Catch::Clara::ParseResultType> *this)

{
  if ((this->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.m_type == Ok) {
    return;
  }
  abort();
}

Assistant:

void enforceOk() const override {

                    // Errors shouldn't reach this point, but if they do
                    // the actual error message will be in m_errorMessage
                    assert( m_type != ResultType::LogicError );
                    assert( m_type != ResultType::RuntimeError );
                    if ( m_type != ResultType::Ok )
                        std::abort();
                }